

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  FILE *__stream;
  size_t sVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 *__arg;
  pthread_t *__newthread;
  undefined4 in_register_0000003c;
  char *__s;
  int i;
  pthread_t local_a8 [10];
  wasm_byte_t awStack_58 [8];
  undefined1 local_50 [8];
  wasm_byte_vec_t binary;
  
  local_a8[9] = 0x10262d;
  uVar1 = wasm_engine_new(CONCAT44(in_register_0000003c,argc));
  local_a8[9] = 0x102644;
  __stream = fopen("threads.wasm","rb");
  if (__stream != (FILE *)0x0) {
    local_a8[9] = 0x10265d;
    fseek(__stream,0,2);
    local_a8[9] = 0x102665;
    sVar2 = ftell(__stream);
    local_a8[9] = 0x102674;
    fseek(__stream,0,0);
    local_a8[9] = 0x102683;
    wasm_byte_vec_new_uninitialized(local_50,sVar2);
    local_a8[9] = 0x102695;
    sVar2 = fread((void *)binary.size,sVar2,1,__stream);
    if (sVar2 == 1) {
      local_a8[9] = 0x1026a7;
      fclose(__stream);
      local_a8[9] = 0x1026b0;
      uVar3 = wasm_store_new(uVar1);
      local_a8[9] = 0x1026bf;
      lVar4 = wasm_module_new(uVar3,local_50);
      if (lVar4 != 0) {
        local_a8[9] = 0x1026d4;
        wasm_byte_vec_delete(local_50);
        local_a8[9] = 0x1026dc;
        uVar5 = wasm_module_share(lVar4);
        local_a8[9] = 0x1026e7;
        wasm_module_delete(lVar4);
        local_a8[9] = 0x1026ef;
        wasm_store_delete(uVar3);
        __newthread = local_a8;
        binary.data = awStack_58;
        for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
          __arg = (undefined8 *)malloc(0x18);
          *(int *)(__arg + 2) = (int)lVar4;
          *__arg = uVar1;
          __arg[1] = uVar5;
          printf("Initializing thread %d...\n");
          pthread_create(__newthread,(pthread_attr_t *)0x0,run,__arg);
          __newthread = __newthread + 1;
        }
        for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
          printf("Waiting for thread: %d\n");
          pthread_join(local_a8[lVar4],(void **)0x0);
        }
        wasm_shared_module_delete(uVar5);
        wasm_engine_delete(uVar1);
        return 0;
      }
      __s = "> Error compiling module!";
      goto LAB_0010275a;
    }
  }
  __s = "> Error loading module!";
LAB_0010275a:
  local_a8[9] = 0x10275f;
  puts(__s);
  return 1;
}

Assistant:

int main(int argc, const char *argv[]) {
  // Initialize.
  wasm_engine_t* engine = wasm_engine_new();

  // Load binary.
  FILE* file = fopen("threads.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile and share.
  own wasm_store_t* store = wasm_store_new(engine);
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  own wasm_shared_module_t* shared = wasm_module_share(module);

  wasm_module_delete(module);
  wasm_store_delete(store);

  // Spawn threads.
  pthread_t threads[N_THREADS];
  for (int i = 0; i < N_THREADS; i++) {
    thread_args* args = malloc(sizeof(thread_args));
    args->id = i;
    args->engine = engine;
    args->module = shared;
    printf("Initializing thread %d...\n", i);
    pthread_create(&threads[i], NULL, &run, args);
  }

  for (int i = 0; i < N_THREADS; i++) {
    printf("Waiting for thread: %d\n", i);
    pthread_join(threads[i], NULL);
  }

  wasm_shared_module_delete(shared);
  wasm_engine_delete(engine);

  return 0;
}